

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS
ref_layer_swap(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT site,REF_BOOL *complete)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_CAVITY ref_cavity;
  REF_BOOL *complete_local;
  REF_INT local_20;
  REF_INT site_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  *complete = 0;
  ref_cavity = (REF_CAVITY)complete;
  complete_local._4_4_ = site;
  local_20 = node1;
  site_local = node0;
  _node1_local = ref_grid;
  uVar1 = ref_cavity_create((REF_CAVITY *)&ref_private_macro_code_rss_1);
  if (uVar1 == 0) {
    uVar1 = ref_cavity_form_edge_swap
                      (_ref_private_macro_code_rss_1,_node1_local,site_local,local_20,
                       complete_local._4_4_);
    if (uVar1 == 0) {
      uVar1 = ref_cavity_enlarge_combined(_ref_private_macro_code_rss_1);
      if (uVar1 == 0) {
        if (_ref_private_macro_code_rss_1->state == REF_CAVITY_VISIBLE) {
          uVar1 = ref_cavity_replace(_ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x367,"ref_layer_swap",(ulong)uVar1,"replace");
            return uVar1;
          }
          ref_cavity->state = REF_CAVITY_VISIBLE;
        }
        ref_grid_local._4_4_ = ref_cavity_free(_ref_private_macro_code_rss_1);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x36a,"ref_layer_swap",(ulong)ref_grid_local._4_4_,"free");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x365,"ref_layer_swap",(ulong)uVar1,"enlarge");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x364
             ,"ref_layer_swap",(ulong)uVar1,"form");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x362,
           "ref_layer_swap",(ulong)uVar1,"create");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

static REF_FCN REF_STATUS ref_layer_swap(REF_GRID ref_grid, REF_INT node0,
                                         REF_INT node1, REF_INT site,
                                         REF_BOOL *complete) {
  REF_CAVITY ref_cavity;
  *complete = REF_FALSE;
  RSS(ref_cavity_create(&ref_cavity), "create");
  RSS(ref_cavity_form_edge_swap(ref_cavity, ref_grid, node0, node1, site),
      "form");
  RSS(ref_cavity_enlarge_combined(ref_cavity), "enlarge");
  if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
    RSS(ref_cavity_replace(ref_cavity), "replace");
    *complete = REF_TRUE;
  }
  RSS(ref_cavity_free(ref_cavity), "free");
  return REF_SUCCESS;
}